

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O1

ValueCallback * __thiscall
SNMPAgent::addCounter64Handler(SNMPAgent *this,char *oid,uint64_t *value,bool overwritePrefix)

{
  SortableOIDType *pSVar1;
  ValueCallback *pVVar2;
  
  if (value != (uint64_t *)0x0) {
    pSVar1 = buildOIDWithPrefix(this,oid,overwritePrefix);
    if (pSVar1 != (SortableOIDType *)0x0) {
      pVVar2 = (ValueCallback *)operator_new(0x20);
      pVVar2->OID = pSVar1;
      pVVar2->type = COUNTER64;
      pVVar2->isSettable = false;
      pVVar2->setOccurred = false;
      pVVar2->_vptr_ValueCallback = (_func_int **)&PTR_buildTypeWithValue_001a4b90;
      pVVar2[1]._vptr_ValueCallback = (_func_int **)value;
      pVVar2 = addHandler(this,pVVar2,false);
      return pVVar2;
    }
  }
  return (ValueCallback *)0x0;
}

Assistant:

ValueCallback* SNMPAgent::addCounter64Handler(const char *oid, uint64_t* value, bool overwritePrefix){
    if(!value) return nullptr;

    SortableOIDType* oidType = buildOIDWithPrefix(oid, overwritePrefix);
    if(!oidType) return nullptr;
    return addHandler(new Counter64Callback(oidType, value), false);
}